

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O2

bool __thiscall
bssl::FindEmailAddressesInName
          (bssl *this,Input name_rdn_sequence,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *contained_email_addresses)

{
  pointer pXVar1;
  bool bVar2;
  bool bVar3;
  X509NameAttribute *this_00;
  Input input;
  Input rhs;
  RelativeDistinguishedName type_and_values;
  string email_address;
  Parser rdn_parser;
  Parser rdn_sequence_parser;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)name_rdn_sequence.data_.size_);
  input.data_.size_ = (size_t)name_rdn_sequence.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&rdn_sequence_parser,input);
  do {
    bVar2 = der::Parser::HasMore(&rdn_sequence_parser);
    if (!bVar2) {
LAB_0038d8c9:
      return !bVar2;
    }
    der::Parser::Parser(&rdn_parser);
    bVar3 = der::Parser::ReadConstructed(&rdn_sequence_parser,0x20000011,&rdn_parser);
    if (!bVar3) {
      return false;
    }
    type_and_values.
    super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    type_and_values.
    super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    type_and_values.
    super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = ReadRdn(&rdn_parser,&type_and_values);
    pXVar1 = type_and_values.
             super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this_00 = type_and_values.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (!bVar3) {
      ::std::_Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
      ~_Vector_base(&type_and_values.
                     super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                   );
      return false;
    }
    for (; this_00 != pXVar1; this_00 = this_00 + 1) {
      rhs.data_.size_ = 9;
      rhs.data_.data_ = kTypeEmailAddressOid;
      bVar3 = der::operator==((Input)(this_00->type).data_,rhs);
      if (bVar3) {
        email_address._M_dataplus._M_p = (pointer)&email_address.field_2;
        email_address._M_string_length = 0;
        email_address.field_2._M_local_buf[0] = '\0';
        bVar3 = X509NameAttribute::ValueAsString(this_00,&email_address);
        if (!bVar3) {
          ::std::__cxx11::string::~string((string *)&email_address);
          ::std::_Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
          ~_Vector_base(&type_and_values.
                         super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                       );
          goto LAB_0038d8c9;
        }
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   name_rdn_sequence.data_.size_,&email_address);
        ::std::__cxx11::string::~string((string *)&email_address);
      }
    }
    ::std::_Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
    ~_Vector_base(&type_and_values.
                   super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                 );
  } while( true );
}

Assistant:

bool FindEmailAddressesInName(
    der::Input name_rdn_sequence,
    std::vector<std::string> *contained_email_addresses) {
  contained_email_addresses->clear();

  der::Parser rdn_sequence_parser(name_rdn_sequence);
  while (rdn_sequence_parser.HasMore()) {
    der::Parser rdn_parser;
    if (!rdn_sequence_parser.ReadConstructed(CBS_ASN1_SET, &rdn_parser)) {
      return false;
    }

    RelativeDistinguishedName type_and_values;
    if (!ReadRdn(&rdn_parser, &type_and_values)) {
      return false;
    }

    for (const auto &type_and_value : type_and_values) {
      if (type_and_value.type == der::Input(kTypeEmailAddressOid)) {
        std::string email_address;
        if (!type_and_value.ValueAsString(&email_address)) {
          return false;
        }
        contained_email_addresses->push_back(std::move(email_address));
      }
    }
  }

  return true;
}